

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::ForwardDynamicsConstraintsNullSpace
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  long startCol;
  Index startRow;
  long in_R8;
  byte in_stack_00000008;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_00000010;
  VectorNd *in_stack_000004b8;
  VectorNd *in_stack_000004c0;
  VectorNd *in_stack_000004c8;
  VectorNd *in_stack_000004d0;
  MatrixNd *in_stack_000004d8;
  MatrixNd *in_stack_000004e0;
  MatrixNd *in_stack_000004f0;
  MatrixNd *in_stack_000004f8;
  VectorNd *in_stack_00000500;
  VectorNd *in_stack_00000508;
  LinearSolver *in_stack_00000510;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe40;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe48;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *in_stack_fffffffffffffe70;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  undefined8 in_stack_fffffffffffffea8;
  ConstraintSet *in_stack_fffffffffffffeb0;
  VectorNd *in_stack_fffffffffffffeb8;
  VectorNd *in_stack_fffffffffffffec0;
  VectorNd *in_stack_fffffffffffffec8;
  Model *in_stack_fffffffffffffed0;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *in_stack_fffffffffffffee0;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_b8 [56];
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_80 [40];
  non_const_type local_58;
  byte local_49;
  long local_40;
  
  local_49 = in_stack_00000008 & 1;
  local_40 = in_R8;
  CalcConstrainedSystemVariables
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0),in_stack_fffffffffffffee0);
  other = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_40 + 0x380);
  local_58 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       (in_stack_00000010);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (in_stack_fffffffffffffe40,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_00000010);
  this = local_80;
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQ
            (in_stack_fffffffffffffe48);
  Eigen::
  HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (in_stack_fffffffffffffe70,(Matrix<double,__1,__1,_0,__1,__1> *)this);
  startCol = local_40 + 0x458;
  startRow = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6e2172);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6e218b);
  this_00 = local_b8;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (this_00,startRow,startCol,(long)this,(long)other);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffe40->m_qr,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             in_stack_00000010);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6e21f1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6e2203);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6e2215);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6e222e);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (this_00,startRow,startCol,(long)this,(long)other);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffe40->m_qr,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             in_stack_00000010);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-(this,other);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe40,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_00000010);
  SolveConstrainedSystemNullSpace
            (in_stack_000004e0,in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,
             in_stack_000004c0,in_stack_000004b8,in_stack_000004f0,in_stack_000004f8,
             in_stack_00000500,in_stack_00000508,in_stack_00000510);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6e236e);
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsConstraintsNullSpace (
  Model &model,
  const VectorNd &Q,
  const VectorNd &QDot,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext
)
{

  LOG << "-------- " << __func__ << " --------" << std::endl;

  CalcConstrainedSystemVariables (model, Q, QDot, Tau, CS, update_kinematics, 
                                  f_ext);

  CS.GT_qr.compute (CS.G.transpose());
  CS.GT_qr.householderQ().evalTo (CS.GT_qr_Q);

  CS.Y = CS.GT_qr_Q.block (0,0,QDot.rows(), CS.G.rows());
  CS.Z = CS.GT_qr_Q.block (0,CS.G.rows(),QDot.rows(), QDot.rows() - CS.G.rows());

  SolveConstrainedSystemNullSpace (CS.H, CS.G, Tau - CS.C, CS.gamma, QDDot
                                   , CS.force, CS.Y, CS.Z, CS.qddot_y, CS.qddot_z, CS.linear_solver);

}